

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cpp
# Opt level: O3

int __thiscall ncnn::MVN::forward(MVN *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  int *piVar2;
  float fVar3;
  int _h;
  uint _c;
  size_t sVar4;
  Allocator *pAVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  Allocator *pAVar9;
  ulong uVar10;
  void *pvVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  void *pvVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  float fVar22;
  
  iVar13 = bottom_blob->w;
  _h = bottom_blob->h;
  _c = bottom_blob->c;
  uVar21 = (ulong)_c;
  sVar4 = bottom_blob->elemsize;
  Mat::create(top_blob,iVar13,_h,_c,sVar4,opt->blob_allocator);
  iVar14 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    pAVar5 = opt->workspace_allocator;
    if (_c != 0) {
      uVar12 = _h * iVar13;
      uVar19 = sVar4 * (long)(int)_c + 3 & 0xfffffffffffffffc;
      if (pAVar5 == (Allocator *)0x0) {
        pvVar11 = malloc(uVar19 + 0x1c);
        uVar10 = (long)pvVar11 + 0x17U & 0xfffffffffffffff0;
        *(void **)(uVar10 - 8) = pvVar11;
      }
      else {
        uVar10 = (*(code *)**(undefined8 **)pAVar5)();
      }
      piVar1 = (int *)(uVar10 + uVar19);
      *(undefined4 *)(uVar10 + uVar19) = 1;
      uVar20 = (ulong)uVar12;
      if (0 < (int)_c) {
        pvVar11 = bottom_blob->data;
        sVar4 = bottom_blob->cstep;
        sVar6 = bottom_blob->elemsize;
        uVar15 = 0;
        do {
          fVar22 = 0.0;
          if (0 < (int)uVar12) {
            uVar18 = 0;
            do {
              fVar22 = fVar22 + *(float *)((long)pvVar11 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar20 != uVar18);
          }
          *(float *)(uVar10 + uVar15 * 4) = fVar22;
          uVar15 = uVar15 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar6);
        } while (uVar15 != uVar21);
        if (this->across_channels == 0) {
          if (0 < (int)_c) {
            pvVar11 = bottom_blob->data;
            sVar4 = bottom_blob->cstep;
            pvVar16 = top_blob->data;
            sVar6 = top_blob->cstep;
            sVar7 = top_blob->elemsize;
            sVar8 = bottom_blob->elemsize;
            uVar15 = 0;
            do {
              if (0 < (int)uVar12) {
                fVar22 = *(float *)(uVar10 + uVar15 * 4);
                uVar18 = 0;
                do {
                  *(float *)((long)pvVar16 + uVar18 * 4) =
                       *(float *)((long)pvVar11 + uVar18 * 4) - fVar22 * (1.0 / (float)(int)uVar12);
                  uVar18 = uVar18 + 1;
                } while (uVar20 != uVar18);
              }
              uVar15 = uVar15 + 1;
              pvVar16 = (void *)((long)pvVar16 + sVar6 * sVar7);
              pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar8);
            } while (uVar15 != uVar21);
          }
        }
        else if (0 < (int)_c) {
          fVar22 = 0.0;
          uVar15 = 0;
          do {
            fVar22 = fVar22 + *(float *)(uVar10 + uVar15 * 4);
            uVar15 = uVar15 + 1;
          } while (uVar21 != uVar15);
          if (0 < (int)_c) {
            pvVar11 = bottom_blob->data;
            sVar4 = bottom_blob->cstep;
            sVar6 = top_blob->cstep;
            sVar7 = top_blob->elemsize;
            pvVar16 = top_blob->data;
            sVar8 = bottom_blob->elemsize;
            uVar15 = 0;
            do {
              if (0 < (int)uVar12) {
                uVar18 = 0;
                do {
                  *(float *)((long)pvVar16 + uVar18 * 4) =
                       *(float *)((long)pvVar11 + uVar18 * 4) - fVar22 / (float)(int)(_c * uVar12);
                  uVar18 = uVar18 + 1;
                } while (uVar20 != uVar18);
              }
              uVar15 = uVar15 + 1;
              pvVar16 = (void *)((long)pvVar16 + sVar6 * sVar7);
              pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar8);
            } while (uVar15 != uVar21);
          }
        }
      }
      if (this->normalize_variance != 0) {
        pAVar9 = opt->workspace_allocator;
        if (pAVar9 == (Allocator *)0x0) {
          pvVar11 = malloc(uVar19 + 0x1c);
          uVar15 = (long)pvVar11 + 0x17U & 0xfffffffffffffff0;
          *(void **)(uVar15 - 8) = pvVar11;
        }
        else {
          uVar15 = (*(code *)**(undefined8 **)pAVar9)();
        }
        *(undefined4 *)(uVar15 + uVar19) = 1;
        if (0 < (int)_c) {
          pvVar11 = top_blob->data;
          sVar4 = top_blob->cstep;
          sVar6 = top_blob->elemsize;
          uVar18 = 0;
          do {
            fVar22 = 0.0;
            if (0 < (int)uVar12) {
              uVar17 = 0;
              do {
                fVar3 = *(float *)((long)pvVar11 + uVar17 * 4);
                fVar22 = fVar22 + fVar3 * fVar3;
                uVar17 = uVar17 + 1;
              } while (uVar20 != uVar17);
            }
            *(float *)(uVar15 + uVar18 * 4) = fVar22;
            uVar18 = uVar18 + 1;
            pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar6);
          } while (uVar18 != uVar21);
          if (this->across_channels == 0) {
            if (0 < (int)_c) {
              pvVar11 = top_blob->data;
              sVar4 = top_blob->cstep;
              sVar6 = top_blob->elemsize;
              uVar18 = 0;
              do {
                if (0 < (int)uVar12) {
                  fVar22 = *(float *)(uVar15 + uVar18 * 4);
                  fVar3 = this->eps;
                  uVar17 = 0;
                  do {
                    *(float *)((long)pvVar11 + uVar17 * 4) =
                         *(float *)((long)pvVar11 + uVar17 * 4) *
                         (1.0 / (SQRT(fVar22 * (1.0 / (float)(int)uVar12)) + fVar3));
                    uVar17 = uVar17 + 1;
                  } while (uVar20 != uVar17);
                }
                uVar18 = uVar18 + 1;
                pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar6);
              } while (uVar18 != uVar21);
            }
          }
          else if (0 < (int)_c) {
            fVar22 = 0.0;
            uVar18 = 0;
            do {
              fVar22 = fVar22 + *(float *)(uVar15 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar21 != uVar18);
            if (0 < (int)_c) {
              fVar3 = this->eps;
              sVar4 = top_blob->cstep;
              sVar6 = top_blob->elemsize;
              pvVar11 = top_blob->data;
              uVar18 = 0;
              do {
                if (0 < (int)uVar12) {
                  uVar17 = 0;
                  do {
                    *(float *)((long)pvVar11 + uVar17 * 4) =
                         *(float *)((long)pvVar11 + uVar17 * 4) *
                         (1.0 / (SQRT(fVar22 / (float)(int)(_c * uVar12)) + fVar3));
                    uVar17 = uVar17 + 1;
                  } while (uVar20 != uVar17);
                }
                uVar18 = uVar18 + 1;
                pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar6);
              } while (uVar18 != uVar21);
            }
          }
        }
        LOCK();
        piVar2 = (int *)(uVar15 + uVar19);
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (pAVar9 == (Allocator *)0x0) {
            if (uVar15 != 0) {
              free(*(void **)(uVar15 - 8));
            }
          }
          else {
            (**(code **)(*(long *)pAVar9 + 8))(pAVar9,uVar15);
          }
        }
      }
      iVar13 = 0;
      iVar14 = 0;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        iVar14 = iVar13;
        if (*piVar1 == 0) {
          if (pAVar5 == (Allocator *)0x0) {
            if (uVar10 != 0) {
              free(*(void **)(uVar10 - 8));
            }
          }
          else {
            (**(code **)(*(long *)pAVar5 + 8))();
          }
        }
      }
    }
  }
  return iVar14;
}

Assistant:

int MVN::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // prepare sum per channel
    Mat sum(channels, elemsize, opt.workspace_allocator);
    if (sum.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float s = 0.f;
        for (int i=0; i<size; i++)
        {
            s += ptr[i];
        }

        sum[q] = s;
    }

    if (across_channels)
    {
        // compute mean across channels
        float mean = 0.f;
        for (int q=0; q<channels; q++)
        {
            mean += sum[q];
        }
        mean = mean / (channels * size);

        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }
    else
    {
        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            float mean = sum[q] / size;

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }

    if (normalize_variance)
    {
        // prepare squared sum per channel
        Mat sqsum(channels, elemsize, opt.workspace_allocator);
        if (sqsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = top_blob.channel(q);

            float s = 0.f;
            for (int i=0; i<size; i++)
            {
                s += ptr[i] * ptr[i];
            }

            sqsum[q] = s;
        }

        if (across_channels)
        {
            // compute squared mean across channels
            float sqmean = 0.f;
            for (int q=0; q<channels; q++)
            {
                sqmean += sqsum[q];
            }
            sqmean = sqmean / (channels * size);

            // normalize variance
            float norm_var = sqrt(sqmean) + eps;
            float norm_var_inv = 1.f / norm_var;

            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
        else
        {
            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);
                float sqmean = sqsum[q] / size;
                float norm_var = sqrt(sqmean) + eps;
                float norm_var_inv = 1.f / norm_var;

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }

    }

    return 0;
}